

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne.h
# Opt level: O2

void __thiscall FastPForLib::ZRandom::seed(ZRandom *this,uint iSeed)

{
  uint uVar1;
  int i;
  long lVar2;
  ulong uVar3;
  
  this->nValues = 0;
  this->MT[0] = iSeed;
  for (lVar2 = 1; lVar2 != 0x270; lVar2 = lVar2 + 1) {
    iSeed = iSeed * 0x10dcd + 1;
    this->MT[lVar2] = iSeed;
  }
  for (uVar3 = 0; uVar3 != 0x270; uVar3 = uVar3 + 1) {
    uVar1 = (int)uVar3 + 0x18d;
    if (0xe2 < uVar3) {
      uVar1 = (int)uVar3 - 0xe3;
    }
    this->map[uVar3] = this->MT + uVar1;
  }
  return;
}

Assistant:

void ZRandom::seed(unsigned iSeed) {
  nValues = 0;
  // Seed the array used in random number generation.
  MT[0] = iSeed;
  for (int i = 1; i < N; ++i) {
    MT[i] = 1 + (69069 * MT[i - 1]);
  }
  // Compute map once to avoid % in inner loop.
  for (int i = 0; i < N; ++i) {
    map[i] = MT + ((i + M) % N);
  }
}